

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>::ClearNodeVector
          (TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *this)

{
  uint local_14;
  hash_t i;
  TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *this_local;
  
  for (local_14 = 0; local_14 < this->Size; local_14 = local_14 + 1) {
    Node::IsNil(this->Nodes + local_14);
  }
  M_Free(this->Nodes);
  this->Nodes = (Node *)0x0;
  this->Size = 0;
  this->LastFree = (Node *)0x0;
  this->NumUsed = 0;
  return;
}

Assistant:

void ClearNodeVector()
	{
		for (hash_t i = 0; i < Size; ++i)
		{
			if (!Nodes[i].IsNil())
			{
				Nodes[i].~Node();
			}
		}
		M_Free(Nodes);
		Nodes = NULL;
		Size = 0;
		LastFree = NULL;
		NumUsed = 0;
	}